

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O0

ASN1_OBJECT *
create_object_with_text_oid(_func_int *get_nid,char *oid,char *short_name,char *long_name)

{
  char *text;
  int iVar1;
  size_t len_00;
  ASN1_OBJECT *pAVar2;
  int local_84;
  ASN1_OBJECT *ret;
  CBB cbb;
  size_t len;
  uint8_t *buf;
  char *long_name_local;
  char *short_name_local;
  char *oid_local;
  _func_int *get_nid_local;
  
  buf = (uint8_t *)long_name;
  long_name_local = short_name;
  short_name_local = oid;
  oid_local = (char *)get_nid;
  iVar1 = CBB_init((CBB *)&ret,0x20);
  text = short_name_local;
  if (iVar1 != 0) {
    len_00 = strlen(short_name_local);
    iVar1 = CBB_add_asn1_oid_from_text((CBB *)&ret,text,len_00);
    if ((iVar1 != 0) &&
       (iVar1 = CBB_finish((CBB *)&ret,(uint8_t **)&len,(size_t *)((long)&cbb.u + 0x18)), iVar1 != 0
       )) {
      if (oid_local == (char *)0x0) {
        local_84 = 0;
      }
      else {
        local_84 = (*(code *)oid_local)();
      }
      pAVar2 = ASN1_OBJECT_create(local_84,(uchar *)len,cbb.u._24_4_,long_name_local,(char *)buf);
      OPENSSL_free((void *)len);
      return (ASN1_OBJECT *)pAVar2;
    }
  }
  ERR_put_error(8,0,0x65,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/obj/obj.cc"
                ,0x163);
  CBB_cleanup((CBB *)&ret);
  return (ASN1_OBJECT *)0x0;
}

Assistant:

static ASN1_OBJECT *create_object_with_text_oid(int (*get_nid)(void),
                                                const char *oid,
                                                const char *short_name,
                                                const char *long_name) {
  uint8_t *buf;
  size_t len;
  CBB cbb;
  if (!CBB_init(&cbb, 32) ||
      !CBB_add_asn1_oid_from_text(&cbb, oid, strlen(oid)) ||
      !CBB_finish(&cbb, &buf, &len)) {
    OPENSSL_PUT_ERROR(OBJ, OBJ_R_INVALID_OID_STRING);
    CBB_cleanup(&cbb);
    return NULL;
  }

  ASN1_OBJECT *ret = ASN1_OBJECT_create(get_nid ? get_nid() : NID_undef, buf,
                                        len, short_name, long_name);
  OPENSSL_free(buf);
  return ret;
}